

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

void Llb_ManMarkInternalPivots(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vMuxes_00;
  Aig_Obj_t *pObj_00;
  ulong uVar2;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMuxes;
  Aig_Man_t *p_local;
  
  vMuxes_00 = Aig_ManMuxesCollect(p);
  Aig_ManMuxesDeref(p,vMuxes_00);
  Aig_ManCleanMarkB(p);
  Llb_ManLabelLiCones(p);
  Aig_ManFanoutStart(p);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
        ((*(ulong *)&pObj_00->field_0x18 >> 5 & 1) != 0)) &&
       ((uVar2 = *(ulong *)&pObj_00->field_0x18 >> 6,
        ((uint)uVar2 & 0x3ffffff) != 1 && (uVar2 & 0x3ffffff) != 0 &&
        (iVar1 = Llb_ManTracePaths(p,pObj_00), 0 < iVar1)))) {
      *(ulong *)&pObj_00->field_0x18 = *(ulong *)&pObj_00->field_0x18 & 0xffffffffffffffef | 0x10;
    }
  }
  Aig_ManFanoutStop(p);
  Aig_ManCleanMarkB(p);
  Aig_ManMuxesRef(p,vMuxes_00);
  Vec_PtrFree(vMuxes_00);
  return;
}

Assistant:

void Llb_ManMarkInternalPivots( Aig_Man_t * p )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;

    // remove refs due to MUXes
    vMuxes = Aig_ManMuxesCollect( p );
    Aig_ManMuxesDeref( p, vMuxes );

    // mark nodes feeding into LIs
    Aig_ManCleanMarkB( p );
    Llb_ManLabelLiCones( p );

    // mark internal nodes
    Aig_ManFanoutStart( p );
    Aig_ManForEachNode( p, pObj, i )
        if ( pObj->fMarkB && pObj->nRefs > 1 )
        {
            if ( Llb_ManTracePaths(p, pObj) > 0 )
                pObj->fMarkA = 1;
            Counter++;
        }
    Aig_ManFanoutStop( p );
//    printf( "TracePath tried = %d.\n", Counter );

    // mark nodes feeding into LIs
    Aig_ManCleanMarkB( p );

    // add refs due to MUXes
    Aig_ManMuxesRef( p, vMuxes );
    Vec_PtrFree( vMuxes );
}